

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O0

Byte * __thiscall
CharStringType2Interpreter::InterpretHintMask
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  EStatusCode EVar1;
  int iVar2;
  size_type sVar3;
  long lVar4;
  LongFilePositionType programCounterStemReadSize;
  EStatusCode status;
  LongFilePositionType inReadLimit_local;
  Byte *inProgramCounter_local;
  CharStringType2Interpreter *this_local;
  
  sVar3 = std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::size
                    (&this->mOperandStack);
  EVar1 = AddStemsCount(this,(unsigned_short)(sVar3 >> 1));
  if (EVar1 == eSuccess) {
    iVar2 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0xc])
                      (this->mImplementationHelper,this,inProgramCounter,inReadLimit);
    if (iVar2 == 0) {
      ClearStack(this);
      lVar4 = (long)(int)(this->mStemsCount / 8 + (uint)((uint)this->mStemsCount % 8 != 0));
      if (inReadLimit < lVar4) {
        this_local = (CharStringType2Interpreter *)0x0;
      }
      else {
        this_local = (CharStringType2Interpreter *)(inProgramCounter + lVar4);
      }
    }
    else {
      this_local = (CharStringType2Interpreter *)0x0;
    }
  }
  else {
    this_local = (CharStringType2Interpreter *)0x0;
  }
  return (Byte *)this_local;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretHintMask(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = AddStemsCount((unsigned short)(mOperandStack.size() / 2)); // assuming this is a shortcut of dropping vstem if got arguments
	if(status != eSuccess)
		return NULL;	

	status = mImplementationHelper->Type2Hintmask(mOperandStack,inProgramCounter, inReadLimit);
	if(status != eSuccess)
		return NULL;

	ClearStack();
	LongFilePositionType programCounterStemReadSize = (mStemsCount/8 + (mStemsCount % 8 != 0 ? 1:0));
	if(programCounterStemReadSize > inReadLimit)
		return NULL;
	return inProgramCounter+programCounterStemReadSize;
}